

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar9;
  ulong uVar8;
  
  uVar5 = *(ulong *)(b32 + 0x18);
  uVar2 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  r->d[0] = uVar2;
  uVar5 = *(ulong *)(b32 + 0x10);
  uVar3 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  r->d[1] = uVar3;
  uVar5 = *(ulong *)(b32 + 8);
  uVar6 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  r->d[2] = uVar6;
  uVar5 = *(ulong *)b32;
  uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  bVar9 = (0xfffffffffffffffd < uVar6 && uVar5 == 0xffffffffffffffff) && 0xbaaedce6af48a03a < uVar3;
  uVar4 = 0;
  if (0xbaaedce6af48a03b < uVar3) {
    uVar4 = (uint)bVar9;
  }
  uVar7 = 0;
  if (0xbfd25e8cd0364140 < uVar2) {
    uVar7 = (uint)bVar9;
  }
  uVar7 = uVar7 | uVar4 | (uVar6 == 0xffffffffffffffff && uVar5 == 0xffffffffffffffff);
  uVar8 = (ulong)uVar7;
  r->d[0] = uVar8 * 0x402da1732fc9bebf + uVar2;
  uVar2 = (ulong)CARRY8(uVar8 * 0x402da1732fc9bebf,uVar2);
  uVar1 = uVar8 * 0x4551231950b75fc4 + uVar3;
  r->d[1] = uVar1 + uVar2;
  uVar2 = (ulong)(CARRY8(uVar8 * 0x4551231950b75fc4,uVar3) || CARRY8(uVar1,uVar2));
  r->d[2] = uVar6 + uVar8 + uVar2;
  r->d[3] = uVar5 + (CARRY8(uVar6,uVar8) || CARRY8(uVar6 + uVar8,uVar2));
  if (overflow != (int *)0x0) {
    *overflow = uVar7;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int over;
    r->d[0] = secp256k1_read_be64(&b32[24]);
    r->d[1] = secp256k1_read_be64(&b32[16]);
    r->d[2] = secp256k1_read_be64(&b32[8]);
    r->d[3] = secp256k1_read_be64(&b32[0]);
    over = secp256k1_scalar_reduce(r, secp256k1_scalar_check_overflow(r));
    if (overflow) {
        *overflow = over;
    }
}